

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valuemapper.hpp
# Opt level: O1

UserObject *
camp_ext::ValueMapper<camp::UserObject,_void>::from
          (UserObject *__return_storage_ptr__,string *param_1)

{
  BadType *__return_storage_ptr___00;
  string local_b0;
  string local_90;
  BadType local_70;
  
  __return_storage_ptr___00 = (BadType *)__cxa_allocate_exception(0x48);
  camp::BadType::BadType(&local_70,stringType,userType);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/fw4spl-org[P]camp/include/camp/valuemapper.hpp"
             ,"");
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b0,
             "static camp::UserObject camp_ext::ValueMapper<camp::UserObject>::from(const std::string &)"
             ,"");
  camp::Error::prepare<camp::BadType>(__return_storage_ptr___00,&local_70,&local_90,0x15f,&local_b0)
  ;
  __cxa_throw(__return_storage_ptr___00,&camp::BadType::typeinfo,camp::Error::~Error);
}

Assistant:

static camp::UserObject from(const std::string&)      {CAMP_ERROR(camp::BadType(camp::stringType,   camp::userType));}